

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

stringstream *
toml::format<char_const*,char_const(&)[15]>(stringstream *ss,char **t,char (*args) [15])

{
  undefined8 *in_RDX;
  long in_RSI;
  stringstream *in_RDI;
  stringstream *ss_00;
  
  ss_00 = in_RDI;
  std::operator<<((ostream *)(in_RSI + 0x10),(char *)*in_RDX);
  format<char_const(&)[15]>(ss_00,(char (*) [15])in_RDI);
  return ss_00;
}

Assistant:

std::string format(std::stringstream& ss, T&& t, Args&&... args)
{
    ss << std::forward<T>(t);
    return format(ss, std::forward<Args>(args)...);
}